

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

SymOpnd * __thiscall
Lowerer::GenerateMarkTempAlloc
          (Lowerer *this,RegOpnd *dstOpnd,size_t allocSize,Instr *insertBeforeInstr)

{
  Func *func;
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar3;
  StackSym *stackSym;
  SymOpnd *src;
  SymOpnd *dst;
  AddrOpnd *pAVar4;
  
  if (dstOpnd == (RegOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6c70,"(dstOpnd)","dstOpnd");
    if (!bVar2) goto LAB_0057e0b7;
    *puVar3 = 0;
  }
  if (allocSize == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6c71,"(allocSize != 0)","allocSize != 0");
    if (!bVar2) goto LAB_0057e0b7;
    *puVar3 = 0;
  }
  if (insertBeforeInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6c72,"(insertBeforeInstr)","insertBeforeInstr");
    if (!bVar2) {
LAB_0057e0b7:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  func = insertBeforeInstr->m_func;
  stackSym = StackSym::New(TyMisc,func);
  Func::StackAllocate(this->m_func,stackSym,(int)allocSize + 8);
  src = IR::SymOpnd::New(&stackSym->super_Sym,8,TyVar,func);
  InsertLea(dstOpnd,&src->super_Opnd,insertBeforeInstr);
  if (this->outerMostLoopLabel == (LabelInstr *)0x0) {
    pAVar4 = IR::AddrOpnd::NewNull(func);
    GenerateMemInit(this,dstOpnd,-8,&pAVar4->super_Opnd,insertBeforeInstr,false);
  }
  else {
    sourceContextId = Func::GetSourceContextId(this->m_func);
    functionId = Func::GetLocalFunctionId(this->m_func);
    bVar2 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01441eb0,HoistMarkTempInitPhase,sourceContextId,functionId);
    if (!bVar2) {
      dst = IR::SymOpnd::New(&stackSym->super_Sym,TyUint64,func);
      pAVar4 = IR::AddrOpnd::NewNull(func);
      InsertMove(&dst->super_Opnd,&pAVar4->super_Opnd,&this->outerMostLoopLabel->super_Instr,false);
    }
  }
  return src;
}

Assistant:

IR::SymOpnd *
Lowerer::GenerateMarkTempAlloc(IR::RegOpnd *const dstOpnd, const size_t allocSize, IR::Instr *const insertBeforeInstr)
{
    Assert(dstOpnd);
    Assert(allocSize != 0);
    Assert(insertBeforeInstr);

    Func *const func = insertBeforeInstr->m_func;

    // Allocate stack space for the reg exp instance, and a slot for the boxed value
    StackSym *const tempObjectSym = StackSym::New(TyMisc, func);
    m_func->StackAllocate(tempObjectSym, (int)(allocSize + sizeof(void *)));
    IR::SymOpnd * tempObjectOpnd = IR::SymOpnd::New(tempObjectSym, sizeof(void *), TyVar, func);
    InsertLea(dstOpnd, tempObjectOpnd, insertBeforeInstr);

    // Initialize the boxed instance slot
    if (this->outerMostLoopLabel == nullptr)
    {
        GenerateMemInit(dstOpnd, -(int)sizeof(void *), IR::AddrOpnd::NewNull(func), insertBeforeInstr, false);
    }
    else if (!PHASE_OFF(Js::HoistMarkTempInitPhase, this->m_func))
    {
        InsertMove(IR::SymOpnd::New(tempObjectSym, TyMachPtr, func), IR::AddrOpnd::NewNull(func), this->outerMostLoopLabel, false);
    }
    return tempObjectOpnd;
}